

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmByteCodeGenerator.cpp
# Opt level: O3

PolymorphicEmitInfo __thiscall Wasm::WasmBytecodeGenerator::EmitLoop(WasmBytecodeGenerator *this)

{
  int iVar1;
  bool bVar2;
  uint label;
  uint uVar3;
  uint label_00;
  RegSlot RVar4;
  uint uVar5;
  BlockInfo *blockInfo;
  RegisterSpace *this_00;
  WasmBinaryReader *pWVar6;
  Types type;
  long lVar7;
  PolymorphicEmitInfo PVar8;
  RegSlot local_68 [2];
  RegSlot curRegs [5];
  
  label = (*this->m_writer->_vptr_IWasmByteCodeWriter[4])();
  uVar3 = (*this->m_writer->_vptr_IWasmByteCodeWriter[4])();
  label_00 = (*this->m_writer->_vptr_IWasmByteCodeWriter[4])();
  pWVar6 = (WasmBinaryReader *)(this->m_funcInfo->m_customReader).ptr;
  if (pWVar6 == (WasmBinaryReader *)0x0) {
    pWVar6 = (this->m_module->m_reader).ptr;
  }
  blockInfo = PushLabel(this,(pWVar6->super_WasmReaderBase).m_currentNode.field_1.block,label,true,
                        true);
  lVar7 = 0;
  do {
    bVar2 = WAsmJs::TypedRegisterAllocator::IsTypeExcluded
                      (&this->mTypedRegisterAllocator,(Types)lVar7);
    RVar4 = 0;
    if (!bVar2) {
      this_00 = WAsmJs::TypedRegisterAllocator::GetRegisterSpace
                          (&this->mTypedRegisterAllocator,(Types)lVar7);
      RVar4 = WAsmJs::RegisterSpace::PeekNextTmpRegister(this_00);
    }
    local_68[lVar7] = RVar4;
    lVar7 = lVar7 + 1;
  } while (lVar7 != 5);
  uVar5 = (*this->m_writer->_vptr_IWasmByteCodeWriter[0x1d])(this->m_writer,(ulong)uVar3,local_68);
  JsUtil::Stack<Wasm::BlockInfo_*,_Memory::ArenaAllocator,_false,_DefaultComparer>::Pop
            (&this->m_blockInfos);
  pWVar6 = (WasmBinaryReader *)(this->m_funcInfo->m_customReader).ptr;
  if (pWVar6 == (WasmBinaryReader *)0x0) {
    pWVar6 = (this->m_module->m_reader).ptr;
  }
  PushLabel(this,(pWVar6->super_WasmReaderBase).m_currentNode.field_1.block,label_00,false,true);
  EmitBlockCommon(this,blockInfo,(bool *)0x0);
  PopLabel(this,label_00);
  (*this->m_writer->_vptr_IWasmByteCodeWriter[0x19])(this->m_writer,(ulong)label,0x25);
  (*this->m_writer->_vptr_IWasmByteCodeWriter[6])(this->m_writer,(ulong)label_00);
  (*this->m_writer->_vptr_IWasmByteCodeWriter[0x19])(this->m_writer,(ulong)uVar3,0x25);
  JsUtil::
  List<Wasm::BlockInfo_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>::
  EnsureArray(&(this->m_blockInfos).list,0);
  iVar1 = (this->m_blockInfos).list.
          super_ReadOnlyList<Wasm::BlockInfo_*,_Memory::ArenaAllocator,_DefaultComparer>.count;
  (this->m_blockInfos).list.
  super_ReadOnlyList<Wasm::BlockInfo_*,_Memory::ArenaAllocator,_DefaultComparer>.buffer[iVar1] =
       blockInfo;
  (this->m_blockInfos).list.
  super_ReadOnlyList<Wasm::BlockInfo_*,_Memory::ArenaAllocator,_DefaultComparer>.count = iVar1 + 1;
  (*this->m_writer->_vptr_IWasmByteCodeWriter[6])(this->m_writer,(ulong)label);
  PVar8 = PopLabel(this,label);
  (*this->m_writer->_vptr_IWasmByteCodeWriter[0x1e])(this->m_writer,(ulong)uVar5);
  PVar8._4_4_ = 0;
  return PVar8;
}

Assistant:

PolymorphicEmitInfo WasmBytecodeGenerator::EmitLoop()
{
    Js::ByteCodeLabel loopTailLabel = m_writer->DefineLabel();
    Js::ByteCodeLabel loopHeadLabel = m_writer->DefineLabel();
    Js::ByteCodeLabel loopLandingPadLabel = m_writer->DefineLabel();

    // Push possibly yielding loop label before capturing all the yielding registers
    BlockInfo* implicitBlockInfo = PushLabel(GetReader()->m_currentNode.block, loopTailLabel);

    // Save the first tmp (per type) of this loop to discern a yield outside the loop in jitloopbody scenario
    Js::RegSlot curRegs[WAsmJs::LIMIT];
    for (WAsmJs::Types type = WAsmJs::Types(0); type != WAsmJs::LIMIT; type = WAsmJs::Types(type + 1))
    {
        uint32 minYield = 0;
        if (!mTypedRegisterAllocator.IsTypeExcluded(type))
        {
            CompileAssert(sizeof(minYield) == sizeof(Js::RegSlot));
            minYield = static_cast<uint32>(mTypedRegisterAllocator.GetRegisterSpace(type)->PeekNextTmpRegister());
        }
        curRegs[type] = minYield;
    }
    uint32 loopId = m_writer->WasmLoopStart(loopHeadLabel, curRegs);

    // Internally we create a block for loop to exit, but semantically, they don't exist so pop it
    m_blockInfos.Pop();

    // We don't want nested block to jump directly to the loop header
    // instead, jump to the landing pad and let it jump back to the loop header
    PushLabel(GetReader()->m_currentNode.block, loopLandingPadLabel, false);
    EmitBlockCommon(implicitBlockInfo);
    PopLabel(loopLandingPadLabel);

    // By default we don't loop, jump over the landing pad
    m_writer->AsmBr(loopTailLabel);
    m_writer->MarkAsmJsLabel(loopLandingPadLabel);
    m_writer->AsmBr(loopHeadLabel);

    // Put the implicit block back on the stack and yield the last expression to it
    m_blockInfos.Push(implicitBlockInfo);
    m_writer->MarkAsmJsLabel(loopTailLabel);
    // Pop the implicit block to resolve the yield correctly
    PolymorphicEmitInfo loopInfo = PopLabel(loopTailLabel);
    m_writer->ExitLoop(loopId);

    return loopInfo;
}